

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivfdec.c
# Opt level: O0

int ivf_read_frame(AvxInputContext *input_ctx,uint8_t **buffer,size_t *bytes_read,
                  size_t *buffer_size,aom_codec_pts_t *pts)

{
  _Bool _Var1;
  uint uVar2;
  size_t sVar3;
  ulong *in_RCX;
  size_t *in_RDX;
  undefined8 *in_RSI;
  ulong *in_R8;
  uint8_t *new_buffer;
  size_t frame_size;
  uchar raw_header [12];
  AvxInputContext *in_stack_ffffffffffffffb0;
  ulong n;
  AvxInputContext *in_stack_ffffffffffffffc0;
  undefined1 auStack_38 [4];
  undefined1 auStack_34 [4];
  ulong *local_30;
  ulong *local_28;
  size_t *local_20;
  undefined8 *local_18;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  memset(&stack0xffffffffffffffc4,0,0xc);
  n = 0;
  sVar3 = read_from_input(in_stack_ffffffffffffffc0,0,(uchar *)in_stack_ffffffffffffffb0);
  if (sVar3 == 0xc) {
    uVar2 = mem_get_le32_as_int(&stack0xffffffffffffffc4);
    n = (ulong)uVar2;
    if (0x10000000 < n) {
      fprintf(_stderr,"Warning: Read invalid frame size (%u)\n",n);
      n = 0;
    }
    if (*local_28 < n) {
      in_stack_ffffffffffffffb0 = (AvxInputContext *)realloc((void *)*local_18,n << 1);
      if (in_stack_ffffffffffffffb0 == (AvxInputContext *)0x0) {
        fprintf(_stderr,"Warning: Failed to allocate compressed data buffer\n");
        n = 0;
      }
      else {
        *local_18 = in_stack_ffffffffffffffb0;
        *local_28 = n << 1;
      }
    }
    if (local_30 != (ulong *)0x0) {
      uVar2 = mem_get_le32_as_int(auStack_38);
      *local_30 = (ulong)uVar2;
      uVar2 = mem_get_le32_as_int(auStack_34);
      *local_30 = ((ulong)uVar2 << 0x20) + *local_30;
    }
  }
  else {
    _Var1 = input_eof(in_stack_ffffffffffffffb0);
    if (!_Var1) {
      fprintf(_stderr,"Warning: Failed to read frame size\n");
    }
  }
  _Var1 = input_eof(in_stack_ffffffffffffffb0);
  if (_Var1) {
    local_4 = 1;
  }
  else {
    sVar3 = read_from_input(in_stack_ffffffffffffffc0,n,(uchar *)in_stack_ffffffffffffffb0);
    if (sVar3 == n) {
      *local_20 = n;
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"Warning: Failed to read full frame\n");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int ivf_read_frame(struct AvxInputContext *input_ctx, uint8_t **buffer,
                   size_t *bytes_read, size_t *buffer_size,
                   aom_codec_pts_t *pts) {
  unsigned char raw_header[IVF_FRAME_HDR_SZ] = { 0 };
  size_t frame_size = 0;

  if (read_from_input(input_ctx, IVF_FRAME_HDR_SZ, raw_header) !=
      IVF_FRAME_HDR_SZ) {
    if (!input_eof(input_ctx))
      fprintf(stderr, "Warning: Failed to read frame size\n");
  } else {
    frame_size = mem_get_le32(raw_header);

    if (frame_size > 256 * 1024 * 1024) {
      fprintf(stderr, "Warning: Read invalid frame size (%u)\n",
              (unsigned int)frame_size);
      frame_size = 0;
    }

    if (frame_size > *buffer_size) {
      uint8_t *new_buffer = (uint8_t *)realloc(*buffer, 2 * frame_size);

      if (new_buffer) {
        *buffer = new_buffer;
        *buffer_size = 2 * frame_size;
      } else {
        fprintf(stderr, "Warning: Failed to allocate compressed data buffer\n");
        frame_size = 0;
      }
    }

    if (pts) {
      *pts = mem_get_le32(&raw_header[4]);
      *pts += ((aom_codec_pts_t)mem_get_le32(&raw_header[8]) << 32);
    }
  }

  if (!input_eof(input_ctx)) {
    ASAN_UNPOISON_MEMORY_REGION(*buffer, *buffer_size);
    if (read_from_input(input_ctx, frame_size, *buffer) != frame_size) {
      fprintf(stderr, "Warning: Failed to read full frame\n");
      return 1;
    }

    ASAN_POISON_MEMORY_REGION(*buffer + frame_size, *buffer_size - frame_size);
    *bytes_read = frame_size;
    return 0;
  }

  return 1;
}